

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

ScatterOut * __thiscall
cert::Metal::scatter
          (ScatterOut *__return_storage_ptr__,Metal *this,Vec3 point,Vec3 normal,UV uv,Ray *r_in,
          PRNG *random)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float local_48;
  
  fVar13 = normal.z;
  fVar12 = normal.y;
  fVar7 = (r_in->direction).x;
  fVar8 = (r_in->direction).y;
  fVar10 = (r_in->direction).z;
  dVar5 = sqrt((double)(ulong)(uint)(fVar10 * fVar10 + fVar7 * fVar7 + fVar8 * fVar8));
  fVar7 = SUB84(dVar5,0);
  fVar10 = (r_in->direction).z / fVar7;
  uVar1 = (r_in->direction).x;
  uVar2 = (r_in->direction).y;
  auVar14._4_4_ = uVar2;
  auVar14._0_4_ = uVar1;
  auVar14._8_8_ = 0;
  auVar15._4_4_ = fVar7;
  auVar15._0_4_ = fVar7;
  auVar15._8_4_ = fVar7;
  auVar15._12_4_ = fVar7;
  auVar15 = divps(auVar14,auVar15);
  local_48 = normal.x;
  fVar8 = fVar10 * fVar13 + auVar15._0_4_ * local_48 + auVar15._4_4_ * fVar12;
  fVar8 = fVar8 + fVar8;
  fVar16 = auVar15._0_4_ - fVar8 * local_48;
  fVar17 = auVar15._4_4_ - fVar8 * fVar12;
  fVar10 = fVar10 - fVar8 * fVar13;
  __return_storage_ptr__->is_scattered = 0.0 < fVar13 * fVar10 + local_48 * fVar16 + fVar12 * fVar17
  ;
  fVar7 = (this->super_Material).albedo.y;
  (__return_storage_ptr__->attenuation).x = (this->super_Material).albedo.x;
  (__return_storage_ptr__->attenuation).y = fVar7;
  (__return_storage_ptr__->attenuation).z = (this->super_Material).albedo.z;
  (__return_storage_ptr__->scattered).origin.x = (float)(int)point._0_8_;
  (__return_storage_ptr__->scattered).origin.y = (float)(int)((ulong)point._0_8_ >> 0x20);
  (__return_storage_ptr__->scattered).origin.z = point.z;
  dVar5 = sqrt((double)(ulong)(uint)(fVar10 * fVar10 + fVar16 * fVar16 + fVar17 * fVar17));
  fVar7 = SUB84(dVar5,0);
  uVar9 = (undefined4)((ulong)dVar5 >> 0x20);
  auVar6._4_4_ = fVar17;
  auVar6._0_4_ = fVar16;
  auVar6._8_4_ = auVar15._8_4_ - fVar8 * in_XMM2_Dc;
  auVar6._12_4_ = auVar15._12_4_ - fVar8 * in_XMM2_Dd;
  auVar3._4_4_ = fVar7;
  auVar3._0_4_ = fVar7;
  auVar3._8_4_ = uVar9;
  auVar3._12_4_ = uVar9;
  auVar15 = divps(auVar6,auVar3);
  (__return_storage_ptr__->scattered).direction.x = (float)(int)auVar15._0_8_;
  (__return_storage_ptr__->scattered).direction.y = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
  (__return_storage_ptr__->scattered).direction.z = fVar10 / fVar7;
  __return_storage_ptr__->index = -1.0;
  (__return_storage_ptr__->refracted).origin.x = 0.0;
  (__return_storage_ptr__->refracted).origin.y = 0.0;
  (__return_storage_ptr__->refracted).origin.z = 0.0;
  dVar5 = sqrt(5.26354424712089e-315);
  uVar9 = SUB84(dVar5,0);
  auVar11._0_12_ = ZEXT812(0x3f800000);
  auVar11._12_4_ = 0;
  auVar4._4_4_ = uVar9;
  auVar4._0_4_ = uVar9;
  auVar4._8_4_ = uVar9;
  auVar4._12_4_ = uVar9;
  auVar15 = divps(auVar11,auVar4);
  (__return_storage_ptr__->refracted).direction.x = (float)(int)auVar15._0_8_;
  (__return_storage_ptr__->refracted).direction.y = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
  (__return_storage_ptr__->refracted).direction.z = auVar15._4_4_;
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 reflected = reflect (normalize (r_in.direction), normal);
		return { .is_scattered = dot (reflected, normal) > 0.0,
			.attenuation = albedo,
			.scattered = Ray (point, reflected) };
	}